

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_chain.cpp
# Opt level: O2

void __thiscall
Chain_column_with_row_access_other<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_>
::test_method(Chain_column_with_row_access_other<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_>
              *this)

{
  Row_container rows;
  vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_>_>
  matrix;
  Column_settings settings;
  
  rows.
  super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rows.
  super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rows.
  super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&settings.operators,5);
  build_column_matrix<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
            (&matrix,&rows,&settings);
  column_test_chain_methods<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>>
            ();
  column_test_boundary_chain_methods<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,true,false,true>>>>
            (&matrix);
  std::
  vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>_>_>
  ::~vector(&matrix);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&settings.operators.inverse_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  ::~vector(&rows);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_z5_column_content_access, Column, z5_no_row_access_columns) {
  typename Column::Column_settings settings(5);
  std::vector<Column> matrix = build_column_matrix<Column>(settings);
  column_test_common_z5_content_access(matrix);
}